

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void idx2::GrowCapacity<idx2::stack_string<128>>
               (array<idx2::stack_string<128>_> *Array,i64 NewCapacity)

{
  buffer Buf_00;
  undefined8 local_40;
  buffer Buf;
  i64 NewCapacity_local;
  array<idx2::stack_string<128>_> *Array_local;
  
  Buf.Alloc = (allocator *)NewCapacity;
  if (NewCapacity == 0) {
    Buf.Alloc = (allocator *)((Array->Capacity * 3) / 2 + 8);
  }
  if (Array->Capacity < (long)Buf.Alloc) {
    Buf.Bytes = (i64)Mallocator();
    local_40 = 0;
    Buf.Data = (byte *)0x0;
    (**Array->Alloc->_vptr_allocator)(Array->Alloc,&local_40,(long)Buf.Alloc * 0x81);
    Buf_00.Bytes = (i64)Buf.Data;
    Buf_00.Data = (byte *)local_40;
    Buf_00.Alloc = (allocator *)Buf.Bytes;
    Relocate<idx2::stack_string<128>>(Array,Buf_00);
    Array->Capacity = (i64)Buf.Alloc;
  }
  return;
}

Assistant:

void
GrowCapacity(array<t>* Array, i64 NewCapacity)
{
  if (NewCapacity == 0) // default
    NewCapacity = Array->Capacity * 3 / 2 + 8;
  if (Array->Capacity < NewCapacity)
  {
    buffer Buf;
    Array->Alloc->Alloc(&Buf, NewCapacity * sizeof(t));
    idx2_Assert(Buf);
    Relocate(Array, Buf);
    Array->Capacity = NewCapacity;
  }
}